

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdToGia2(Gia_Man_t *pGia,char *p,int *pLits,Vec_Int_t *vCover)

{
  int iVar1;
  int *pMatches;
  char *local_28;
  
  local_28 = p;
  if (*p == '1') {
    if (p[1] == '\0') {
      iVar1 = 1;
      goto LAB_0050e684;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    iVar1 = 0;
    goto LAB_0050e684;
  }
  pMatches = Dau_DsdComputeMatches(p);
  iVar1 = Dau_DsdToGia2_rec(pGia,p,&local_28,pMatches,pLits,vCover);
LAB_0050e684:
  if (local_28[1] == '\0') {
    return iVar1;
  }
  local_28 = local_28 + 1;
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                ,0xcc,"int Dau_DsdToGia2(Gia_Man_t *, char *, int *, Vec_Int_t *)");
}

Assistant:

int Dau_DsdToGia2( Gia_Man_t * pGia, char * p, int * pLits, Vec_Int_t * vCover )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Dau_DsdToGia2_rec( pGia, p, &p, Dau_DsdComputeMatches(p), pLits, vCover );
    assert( *++p == 0 );
    return Res;
}